

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_threshold_double_CALL(WorkerP *w,Task *__dq_head,MTBDD arg_1,double arg_2)

{
  TD_mtbdd_uapply *t;
  Task _t;
  undefined1 local_48 [32];
  double local_28;
  
  local_48._0_8_ = mtbdd_uapply_WRAP;
  local_48._8_8_ = (_Worker *)0x1;
  local_48._24_8_ = mtbdd_op_threshold_double_CALL;
  local_48._16_8_ = arg_1;
  local_28 = arg_2;
  lace_run_task((Task *)local_48);
  return local_48._16_8_;
}

Assistant:

MTBDD
mtbdd_makeleaf(uint32_t type, uint64_t value)
{
    struct mtbddnode n;
    mtbddnode_makeleaf(&n, type, value);

    int custom = sylvan_mt_has_custom_hash(type);

    int created;
    uint64_t index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        RUN(sylvan_gc);

        index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return (MTBDD)index;
}